

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
          (QGenericArrayOps<QDockAreaLayoutItem> *this,qsizetype i,QDockAreaLayoutItem *args)

{
  QDockAreaLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_a8;
  QDockAreaLayoutItem tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QDockAreaLayoutItem>).size == i) {
      qVar5 = QArrayDataPointer<QDockAreaLayoutItem>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QDockAreaLayoutItem>);
      if (qVar5 == 0) goto LAB_003d2201;
      QDockAreaLayoutItem::QDockAreaLayoutItem
                ((this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr +
                 (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size,args);
LAB_003d231c:
      pqVar2 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_003d22d5;
    }
LAB_003d2201:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDockAreaLayoutItem>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QDockAreaLayoutItem>);
      if (qVar5 != 0) {
        QDockAreaLayoutItem::QDockAreaLayoutItem
                  ((this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr + -1,args);
        ppQVar1 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_003d231c;
      }
    }
  }
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.placeHolderItem = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
  tmp._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.widgetItem = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.subinfo = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutItem::QDockAreaLayoutItem(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size != 0;
  QArrayDataPointer<QDockAreaLayoutItem>::detachAndGrow
            (&this->super_QArrayDataPointer<QDockAreaLayoutItem>,(uint)(i == 0 && bVar6),1,
             (QDockAreaLayoutItem **)0x0,(QArrayDataPointer<QDockAreaLayoutItem> *)0x0);
  if (i == 0 && bVar6) {
    QDockAreaLayoutItem::QDockAreaLayoutItem
              ((this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr + -1,&tmp);
    ppQVar1 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (QDockAreaLayoutItem *)0x0;
    local_a8.last = (QDockAreaLayoutItem *)0x0;
    local_a8.where = (QDockAreaLayoutItem *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
    local_a8.data = &this->super_QArrayDataPointer<QDockAreaLayoutItem>;
    Inserter::insertOne(&local_a8,i,&tmp);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QDockAreaLayoutItem::~QDockAreaLayoutItem(&tmp);
LAB_003d22d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }